

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

int mpc_ast_eq(mpc_ast_t *a,mpc_ast_t *b)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = strcmp(a->tag,b->tag);
  if (((iVar2 == 0) && (iVar2 = strcmp(a->contents,b->contents), iVar2 == 0)) &&
     (uVar1 = a->children_num, uVar1 == b->children_num)) {
    uVar3 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    do {
      if (uVar4 == uVar3) {
        return 1;
      }
      iVar2 = mpc_ast_eq(a->children[uVar3],b->children[uVar3]);
      uVar3 = uVar3 + 1;
    } while (iVar2 != 0);
  }
  return 0;
}

Assistant:

int mpc_ast_eq(mpc_ast_t *a, mpc_ast_t *b) {

  int i;

  if (strcmp(a->tag, b->tag) != 0) { return 0; }
  if (strcmp(a->contents, b->contents) != 0) { return 0; }
  if (a->children_num != b->children_num) { return 0; }

  for (i = 0; i < a->children_num; i++) {
    if (!mpc_ast_eq(a->children[i], b->children[i])) { return 0; }
  }

  return 1;
}